

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artist.h
# Opt level: O3

void __thiscall
artist::artist(artist *this,person *p,string *r,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *i)

{
  person::person(&this->super_person,p);
  (this->super_person)._vptr_person = (_func_int **)&PTR__artist_00110d58;
  (this->role)._M_dataplus._M_p = (pointer)&(this->role).field_2;
  (this->role)._M_string_length = 0;
  (this->role).field_2._M_local_buf[0] = '\0';
  (this->instruments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->instruments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->instruments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->role,r);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->instruments,i);
  return;
}

Assistant:

artist( const person &p, const std::string &r, const std::vector < std::string > &i ) : person(p){
        role = r;
        instruments = i;
    }